

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCNF.hpp
# Opt level: O1

bool __thiscall Shell::NewCNF::Occurrences::Iterator::hasNext(Iterator *this)

{
  bool bVar1;
  List<Shell::NewCNF::Occurrence> *pLVar2;
  List<Shell::NewCNF::Occurrence> *pLVar3;
  void **head;
  List<Shell::NewCNF::Occurrence> **ppLVar4;
  List<Shell::NewCNF::Occurrence> **ppLVar5;
  Occurrence occ;
  SmartPtr<Shell::NewCNF::Occurrence> local_68;
  GenClause *local_58;
  RefCounter *local_50;
  uint local_48;
  GenClause *local_40;
  RefCounter *local_38;
  
  do {
    ppLVar4 = (this->_iterator)._lst;
    pLVar2 = (this->_iterator)._cur;
    ppLVar5 = &pLVar2->_tail;
    if (pLVar2 == (List<Shell::NewCNF::Occurrence> *)0x0) {
      ppLVar5 = ppLVar4;
    }
    pLVar3 = *ppLVar5;
    if (pLVar3 == (List<Shell::NewCNF::Occurrence> *)0x0) break;
    if (pLVar2 != (List<Shell::NewCNF::Occurrence> *)0x0) {
      (this->_iterator)._prev = pLVar2;
      ppLVar4 = &pLVar2->_tail;
    }
    pLVar2 = *ppLVar4;
    (this->_iterator)._cur = pLVar2;
    local_58 = (pLVar2->_head).gc._obj;
    local_50 = (pLVar2->_head).gc._refCnt;
    if (local_50 != (RefCounter *)0x0 && local_58 != (GenClause *)0x0) {
      local_50->_val = local_50->_val + 1;
    }
    local_48 = (pLVar2->_head).position;
    bVar1 = local_58->valid;
    if (bVar1 == false) {
      ::Lib::List<Shell::NewCNF::Occurrence>::DelIterator::del(&this->_iterator);
    }
    else {
      local_68._obj =
           (Occurrence *)
           ::Lib::FixedSizeAllocator<24UL>::alloc
                     ((FixedSizeAllocator<24UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
      local_40 = local_58;
      local_38 = local_50;
      if (local_50 != (RefCounter *)0x0 && local_58 != (GenClause *)0x0) {
        local_50->_val = local_50->_val + 1;
      }
      ((local_68._obj)->gc)._obj = local_58;
      ((local_68._obj)->gc)._refCnt = local_50;
      if (local_50 != (RefCounter *)0x0 && local_58 != (GenClause *)0x0) {
        local_50->_val = local_50->_val + 1;
      }
      (local_68._obj)->position = local_48;
      local_68._refCnt =
           (RefCounter *)
           ::Lib::FixedSizeAllocator<8UL>::alloc
                     ((FixedSizeAllocator<8UL> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
      (local_68._refCnt)->_val = 1;
      ::Lib::SmartPtr<Shell::NewCNF::Occurrence>::operator=(&this->_current,&local_68);
      if (((local_68._obj != (Occurrence *)0x0) && (local_68._refCnt != (RefCounter *)0x0)) &&
         ((local_68._refCnt)->_val = (local_68._refCnt)->_val + -1, (local_68._refCnt)->_val == 0))
      {
        checked_delete<Shell::NewCNF::Occurrence>(local_68._obj);
        if (local_68._refCnt != (RefCounter *)0x0) {
          *(undefined8 *)local_68._refCnt = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68._refCnt;
        }
      }
      if (((local_40 != (GenClause *)0x0) && (local_38 != (RefCounter *)0x0)) &&
         (local_38->_val = local_38->_val + -1, local_38->_val == 0)) {
        checked_delete<Shell::NewCNF::GenClause>(local_40);
        if (local_38 != (RefCounter *)0x0) {
          *(undefined8 *)local_38 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_38;
        }
      }
    }
    if (((local_58 != (GenClause *)0x0) && (local_50 != (RefCounter *)0x0)) &&
       (local_50->_val = local_50->_val + -1, local_50->_val == 0)) {
      checked_delete<Shell::NewCNF::GenClause>(local_58);
      if (local_50 != (RefCounter *)0x0) {
        *(undefined8 *)local_50 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_50;
      }
    }
  } while (bVar1 == false);
  return pLVar3 != (List<Shell::NewCNF::Occurrence> *)0x0;
}

Assistant:

inline bool hasNext() {
        while (_iterator.hasNext()) {
          Occurrence occ = _iterator.next();
          if (!occ.gc->valid) {
            _iterator.del();
            continue;
          }
          _current = SmartPtr<Occurrence>(new Occurrence(occ.gc, occ.position));
          return true;
        }
        return false;
      }